

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                   string *validation_name,string *item_name,
                   vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                   *objects_info,XrReferenceSpaceType value)

{
  bool bVar1;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  allocator local_b9;
  string vuid;
  string error_str;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_78;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_60;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_48;
  
  if (value - XR_REFERENCE_SPACE_TYPE_VIEW < 3) {
    return true;
  }
  if (value == XR_REFERENCE_SPACE_TYPE_LOCAL_FLOOR) {
    return true;
  }
  if (value == XR_REFERENCE_SPACE_TYPE_COMBINED_EYE_VARJO) {
    if (instance_info == (GenValidUsageXrInstanceInfo *)0x0) {
      return true;
    }
    bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,"XR_VARJO_foveated_rendering");
    if (bVar1) {
      return true;
    }
    std::__cxx11::string::string((string *)&vuid,"VUID-",(allocator *)&error_str);
    std::__cxx11::string::append((string *)&vuid);
    std::__cxx11::string::append((char *)&vuid);
    std::__cxx11::string::append((string *)&vuid);
    std::__cxx11::string::append((char *)&vuid);
    std::__cxx11::string::string
              ((string *)&error_str,
               "XrReferenceSpaceType value \"XR_REFERENCE_SPACE_TYPE_COMBINED_EYE_VARJO\"",&local_b9
              );
    std::__cxx11::string::append((char *)&error_str);
    std::__cxx11::string::append((char *)&error_str);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_60,objects_info);
    CoreValidLogMessage(instance_info,&vuid,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_60,&error_str);
    this = &local_60;
  }
  else if (value == XR_REFERENCE_SPACE_TYPE_LOCALIZATION_MAP_ML) {
    if (instance_info == (GenValidUsageXrInstanceInfo *)0x0) {
      return true;
    }
    bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,"XR_ML_localization_map");
    if (bVar1) {
      return true;
    }
    std::__cxx11::string::string((string *)&vuid,"VUID-",(allocator *)&error_str);
    std::__cxx11::string::append((string *)&vuid);
    std::__cxx11::string::append((char *)&vuid);
    std::__cxx11::string::append((string *)&vuid);
    std::__cxx11::string::append((char *)&vuid);
    std::__cxx11::string::string
              ((string *)&error_str,
               "XrReferenceSpaceType value \"XR_REFERENCE_SPACE_TYPE_LOCALIZATION_MAP_ML\"",
               &local_b9);
    std::__cxx11::string::append((char *)&error_str);
    std::__cxx11::string::append((char *)&error_str);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_78,objects_info);
    CoreValidLogMessage(instance_info,&vuid,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_78,&error_str);
    this = &local_78;
  }
  else {
    if (value != XR_REFERENCE_SPACE_TYPE_UNBOUNDED_MSFT) {
      return false;
    }
    if (instance_info == (GenValidUsageXrInstanceInfo *)0x0) {
      return true;
    }
    bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,"XR_MSFT_unbounded_reference_space")
    ;
    if (bVar1) {
      return true;
    }
    std::__cxx11::string::string((string *)&vuid,"VUID-",(allocator *)&error_str);
    std::__cxx11::string::append((string *)&vuid);
    std::__cxx11::string::append((char *)&vuid);
    std::__cxx11::string::append((string *)&vuid);
    std::__cxx11::string::append((char *)&vuid);
    std::__cxx11::string::string
              ((string *)&error_str,
               "XrReferenceSpaceType value \"XR_REFERENCE_SPACE_TYPE_UNBOUNDED_MSFT\"",&local_b9);
    std::__cxx11::string::append((char *)&error_str);
    std::__cxx11::string::append((char *)&error_str);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_48,objects_info);
    CoreValidLogMessage(instance_info,&vuid,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_48,&error_str);
    this = &local_48;
  }
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(this);
  std::__cxx11::string::~string((string *)&error_str);
  std::__cxx11::string::~string((string *)&vuid);
  return false;
}

Assistant:

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,
                    const std::string &command_name,
                    const std::string &validation_name,
                    const std::string &item_name,
                    std::vector<GenValidUsageXrObjectInfo>& objects_info,
                    const XrReferenceSpaceType value) {
    (void)instance_info;  // quiet warnings
    (void)command_name;  // quiet warnings
    (void)validation_name;  // quiet warnings
    (void)item_name;  // quiet warnings
    (void)objects_info;  // quiet warnings
    switch (value) {
        case XR_REFERENCE_SPACE_TYPE_VIEW:
            return true;
        case XR_REFERENCE_SPACE_TYPE_LOCAL:
            return true;
        case XR_REFERENCE_SPACE_TYPE_STAGE:
            return true;
        case XR_REFERENCE_SPACE_TYPE_LOCAL_FLOOR:
            return true;
        case XR_REFERENCE_SPACE_TYPE_UNBOUNDED_MSFT:
            // Enum value XR_REFERENCE_SPACE_TYPE_UNBOUNDED_MSFT requires extension XR_MSFT_unbounded_reference_space, so check that it is enabled
            if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_MSFT_unbounded_reference_space")) {
                std::string vuid = "VUID-";
                vuid += validation_name;
                vuid += "-";
                vuid += item_name;
                vuid += "-parameter";
                std::string error_str = "XrReferenceSpaceType value \"XR_REFERENCE_SPACE_TYPE_UNBOUNDED_MSFT\"";
                error_str += " being used, which requires extension ";
                error_str += " \"XR_MSFT_unbounded_reference_space\" to be enabled, but it is not enabled";
                CoreValidLogMessage(instance_info, vuid,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, error_str);
                return false;
            }
            return true;
        case XR_REFERENCE_SPACE_TYPE_COMBINED_EYE_VARJO:
            // Enum value XR_REFERENCE_SPACE_TYPE_COMBINED_EYE_VARJO requires extension XR_VARJO_foveated_rendering, so check that it is enabled
            if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_VARJO_foveated_rendering")) {
                std::string vuid = "VUID-";
                vuid += validation_name;
                vuid += "-";
                vuid += item_name;
                vuid += "-parameter";
                std::string error_str = "XrReferenceSpaceType value \"XR_REFERENCE_SPACE_TYPE_COMBINED_EYE_VARJO\"";
                error_str += " being used, which requires extension ";
                error_str += " \"XR_VARJO_foveated_rendering\" to be enabled, but it is not enabled";
                CoreValidLogMessage(instance_info, vuid,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, error_str);
                return false;
            }
            return true;
        case XR_REFERENCE_SPACE_TYPE_LOCALIZATION_MAP_ML:
            // Enum value XR_REFERENCE_SPACE_TYPE_LOCALIZATION_MAP_ML requires extension XR_ML_localization_map, so check that it is enabled
            if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_ML_localization_map")) {
                std::string vuid = "VUID-";
                vuid += validation_name;
                vuid += "-";
                vuid += item_name;
                vuid += "-parameter";
                std::string error_str = "XrReferenceSpaceType value \"XR_REFERENCE_SPACE_TYPE_LOCALIZATION_MAP_ML\"";
                error_str += " being used, which requires extension ";
                error_str += " \"XR_ML_localization_map\" to be enabled, but it is not enabled";
                CoreValidLogMessage(instance_info, vuid,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, error_str);
                return false;
            }
            return true;
    default:
        return false;
}
}